

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QString * QDir::toNativeSeparators(QString *__return_storage_ptr__,QString *pathName)

{
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&pathName->d);
  return __return_storage_ptr__;
}

Assistant:

QString QDir::toNativeSeparators(const QString &pathName)
{
#if defined(Q_OS_WIN)
    qsizetype i = pathName.indexOf(u'/');
    if (i != -1) {
        QString n(pathName);

        QChar * const data = n.data();
        data[i++] = u'\\';

        for (; i < n.length(); ++i) {
            if (data[i] == u'/')
                data[i] = u'\\';
        }

        return n;
    }
#endif
    return pathName;
}